

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O2

void __thiscall
Move::Move(Move *this,Position *initialPosition,Position *lastPosition,NurseSolution *movedNurse,
          NurseSolution *tradedNurse)

{
  Position::Position(&this->initialPosition,initialPosition);
  Position::Position(&this->lastPosition,lastPosition);
  this->movedNurse = movedNurse;
  this->tradedNurse = tradedNurse;
  return;
}

Assistant:

Move::Move(Position initialPosition,Position lastPosition, NurseSolution* movedNurse, NurseSolution* tradedNurse) : initialPosition(initialPosition), lastPosition(lastPosition), movedNurse(movedNurse) , tradedNurse(tradedNurse){}